

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_object(Dispatch_Engine *this,Boxed_Value *o)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  char local_39;
  string local_38;
  
  bVar4 = ((((o->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_type_info).m_flags & 1) == 0;
  pcVar3 = "const ";
  if (bVar4) {
    pcVar3 = "";
  }
  lVar2 = 6;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  get_type_name_abi_cxx11_
            (&local_38,this,
             &((o->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->m_type_info);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_39,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dump_object(const Boxed_Value &o) const { std::cout << (o.is_const() ? "const " : "") << type_name(o) << '\n'; }